

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

ON_OffsetSurface * __thiscall
ON_OffsetSurface::operator=(ON_OffsetSurface *this,ON_OffsetSurface *src)

{
  ON_OffsetSurface *pOVar1;
  ON_Surface *pOVar2;
  
  if (this != src) {
    pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
    if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
      (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[4])();
    }
    this->m__pSrf = (ON_Surface *)0x0;
    if (src->m__pSrf == (ON_Surface *)0x0) {
      ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    }
    else {
      pOVar2 = ON_SurfaceProxy::DuplicateSurface(&src->super_ON_SurfaceProxy);
      this->m__pSrf = pOVar2;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pOVar2);
    }
    ON_OffsetSurfaceFunction::operator=(&this->m_offset_function,&src->m_offset_function);
    pOVar2 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar2);
  }
  return this;
}

Assistant:

ON_OffsetSurface& ON_OffsetSurface::operator=(const ON_OffsetSurface& src)
{
  if ( this != &src )
  {
    if ( 0 != m__pSrf && this != m__pSrf )
      delete m__pSrf;
    m__pSrf = 0;
    if ( 0 != src.m__pSrf )
    {
      m__pSrf = src.ON_SurfaceProxy::DuplicateSurface();
      SetProxySurface(m__pSrf);
    }
    else
    {
      ON_SurfaceProxy::operator=(src);
    }
    m_offset_function = src.m_offset_function;
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return *this;
}